

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::
HeapDisposer<kj::_::TransformPromiseNode<kj::Own<kj::AsyncIoStream>,_kj::_::Void,_kj::CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:1955:35),_kj::Own<kj::AsyncCapabilityStream>_>,_kj::_::PropagateException>_>
::disposeImpl(HeapDisposer<kj::_::TransformPromiseNode<kj::Own<kj::AsyncIoStream>,_kj::_::Void,_kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_c__:1955:35),_kj::Own<kj::AsyncCapabilityStream>_>,_kj::_::PropagateException>_>
              *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    TransformPromiseNodeBase::dropDependency((TransformPromiseNodeBase *)pointer);
    Own<kj::AsyncCapabilityStream>::dispose
              ((Own<kj::AsyncCapabilityStream> *)((long)pointer + 0x28));
    TransformPromiseNodeBase::~TransformPromiseNodeBase((TransformPromiseNodeBase *)pointer);
  }
  operator_delete(pointer,0x40);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }